

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O1

bool cmQtAutoGenerator::FileWrite(string *filename,string *content,string *error)

{
  bool bVar1;
  char *pcVar2;
  ofstream ofs;
  undefined1 local_220 [32];
  byte abStack_200 [216];
  ios_base local_128 [264];
  
  bVar1 = MakeParentDirectory(filename);
  if (!bVar1) {
    if (error != (string *)0x0) {
      std::__cxx11::string::_M_replace((ulong)error,0,(char *)error->_M_string_length,0x6f4185);
      return false;
    }
    return false;
  }
  std::ofstream::ofstream(local_220);
  std::ofstream::open(local_220,(_Ios_Openmode)(filename->_M_dataplus)._M_p);
  if ((abStack_200[(long)*(_func_int **)(local_220._0_8_ + -0x18)] & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_220,(content->_M_dataplus)._M_p,content->_M_string_length);
    if (*(int *)(abStack_200 + (long)*(_func_int **)(local_220._0_8_ + -0x18)) == 0) {
      bVar1 = true;
      goto LAB_00485db3;
    }
    if (error == (string *)0x0) goto LAB_00485dab;
    pcVar2 = "File writing failed.";
  }
  else {
    if (error == (string *)0x0) {
LAB_00485dab:
      bVar1 = false;
      goto LAB_00485db3;
    }
    pcVar2 = "Opening file for writing failed.";
  }
  bVar1 = false;
  std::__cxx11::string::_M_replace((ulong)error,0,(char *)error->_M_string_length,(ulong)pcVar2);
LAB_00485db3:
  local_220._0_8_ = _VTT;
  *(undefined8 *)(local_220 + (long)_VTT[-3]) = _EVP_PKEY_get_bn_param;
  std::filebuf::~filebuf((filebuf *)(local_220 + 8));
  std::ios_base::~ios_base(local_128);
  return bVar1;
}

Assistant:

bool cmQtAutoGenerator::FileWrite(std::string const& filename,
                                  std::string const& content,
                                  std::string* error)
{
  // Make sure the parent directory exists
  if (!cmQtAutoGenerator::MakeParentDirectory(filename)) {
    if (error != nullptr) {
      *error = "Could not create parent directory.";
    }
    return false;
  }
  cmsys::ofstream ofs;
  ofs.open(filename.c_str(),
           (std::ios::out | std::ios::binary | std::ios::trunc));

  // Use lambda to save destructor calls of ofs
  return [&ofs, &content, error]() -> bool {
    if (!ofs) {
      if (error != nullptr) {
        *error = "Opening file for writing failed.";
      }
      return false;
    }
    ofs << content;
    if (!ofs.good()) {
      if (error != nullptr) {
        *error = "File writing failed.";
      }
      return false;
    }
    return true;
  }();
}